

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int doParseXmlDecl(_func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *encodingFinder,
                  int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                  char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                  int *standalone)

{
  int iVar1;
  ENCODING *pEVar2;
  char *pcStack_58;
  int c;
  char *nameEnd;
  char *name;
  char *val;
  char **badPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  _func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *p_Stack_18;
  int isGeneralTextEntity_local;
  _func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *encodingFinder_local;
  
  name = (char *)0x0;
  nameEnd = (char *)0x0;
  pcStack_58 = (char *)0x0;
  end_local = ptr + enc->minBytesPerChar * 5;
  badPtr_local = (char **)(end + -(long)(enc->minBytesPerChar << 1));
  val = (char *)badPtr;
  ptr_local = (char *)enc;
  enc_local._4_4_ = isGeneralTextEntity;
  p_Stack_18 = encodingFinder;
  iVar1 = parsePseudoAttribute
                    (enc,end_local,(char *)badPtr_local,&nameEnd,&stack0xffffffffffffffa8,&name,
                     &end_local);
  if ((iVar1 == 0) || (nameEnd == (char *)0x0)) {
    *(char **)val = end_local;
    return 0;
  }
  iVar1 = (**(code **)(ptr_local + 0x28))(ptr_local,nameEnd,pcStack_58,"version");
  if (iVar1 == 0) {
    if (enc_local._4_4_ == 0) {
      *(char **)val = nameEnd;
      return 0;
    }
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = name;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = end_local;
    }
    iVar1 = parsePseudoAttribute
                      ((ENCODING *)ptr_local,end_local,(char *)badPtr_local,&nameEnd,
                       &stack0xffffffffffffffa8,&name,&end_local);
    if (iVar1 == 0) {
      *(char **)val = end_local;
      return 0;
    }
    if (nameEnd == (char *)0x0) {
      if (enc_local._4_4_ != 0) {
        *(char **)val = end_local;
        return 0;
      }
      return 1;
    }
  }
  iVar1 = (**(code **)(ptr_local + 0x28))(ptr_local,nameEnd,pcStack_58,"encoding");
  if (iVar1 != 0) {
    iVar1 = toAscii((ENCODING *)ptr_local,name,(char *)badPtr_local);
    if (((iVar1 < 0x61) || (0x7a < iVar1)) && ((iVar1 < 0x41 || (0x5a < iVar1)))) {
      *(char **)val = name;
      return 0;
    }
    if (encodingName != (char **)0x0) {
      *encodingName = name;
    }
    if (encoding != (ENCODING **)0x0) {
      pEVar2 = (*p_Stack_18)((ENCODING *)ptr_local,name,
                             end_local + -(long)*(int *)(ptr_local + 0x78));
      *encoding = pEVar2;
    }
    iVar1 = parsePseudoAttribute
                      ((ENCODING *)ptr_local,end_local,(char *)badPtr_local,&nameEnd,
                       &stack0xffffffffffffffa8,&name,&end_local);
    if (iVar1 == 0) {
      *(char **)val = end_local;
      return 0;
    }
    if (nameEnd == (char *)0x0) {
      return 1;
    }
  }
  iVar1 = (**(code **)(ptr_local + 0x28))(ptr_local,nameEnd,pcStack_58,"standalone");
  if ((iVar1 == 0) || (enc_local._4_4_ != 0)) {
    *(char **)val = nameEnd;
    encodingFinder_local._4_4_ = 0;
  }
  else {
    iVar1 = (**(code **)(ptr_local + 0x28))
                      (ptr_local,name,(long)end_local - (long)*(int *)(ptr_local + 0x78),"yes");
    if (iVar1 == 0) {
      iVar1 = (**(code **)(ptr_local + 0x28))
                        (ptr_local,name,(long)end_local - (long)*(int *)(ptr_local + 0x78),"no");
      if (iVar1 == 0) {
        *(char **)val = name;
        return 0;
      }
      if (standalone != (int *)0x0) {
        *standalone = 0;
      }
    }
    else if (standalone != (int *)0x0) {
      *standalone = 1;
    }
    while( true ) {
      iVar1 = toAscii((ENCODING *)ptr_local,end_local,(char *)badPtr_local);
      iVar1 = isSpace(iVar1);
      if (iVar1 == 0) break;
      end_local = end_local + *(int *)(ptr_local + 0x78);
    }
    if ((char **)end_local == badPtr_local) {
      encodingFinder_local._4_4_ = 1;
    }
    else {
      *(char **)val = end_local;
      encodingFinder_local._4_4_ = 0;
    }
  }
  return encodingFinder_local._4_4_;
}

Assistant:

static int
doParseXmlDecl(const ENCODING *(*encodingFinder)(const ENCODING *, const char *,
                                                 const char *),
               int isGeneralTextEntity, const ENCODING *enc, const char *ptr,
               const char *end, const char **badPtr, const char **versionPtr,
               const char **versionEndPtr, const char **encodingName,
               const ENCODING **encoding, int *standalone) {
  const char *val = NULL;
  const char *name = NULL;
  const char *nameEnd = NULL;
  ptr += 5 * enc->minBytesPerChar;
  end -= 2 * enc->minBytesPerChar;
  if (! parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)
      || ! name) {
    *badPtr = ptr;
    return 0;
  }
  if (! XmlNameMatchesAscii(enc, name, nameEnd, KW_version)) {
    if (! isGeneralTextEntity) {
      *badPtr = name;
      return 0;
    }
  } else {
    if (versionPtr)
      *versionPtr = val;
    if (versionEndPtr)
      *versionEndPtr = ptr;
    if (! parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (! name) {
      if (isGeneralTextEntity) {
        /* a TextDecl must have an EncodingDecl */
        *badPtr = ptr;
        return 0;
      }
      return 1;
    }
  }
  if (XmlNameMatchesAscii(enc, name, nameEnd, KW_encoding)) {
    int c = toAscii(enc, val, end);
    if (! (ASCII_a <= c && c <= ASCII_z) && ! (ASCII_A <= c && c <= ASCII_Z)) {
      *badPtr = val;
      return 0;
    }
    if (encodingName)
      *encodingName = val;
    if (encoding)
      *encoding = encodingFinder(enc, val, ptr - enc->minBytesPerChar);
    if (! parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (! name)
      return 1;
  }
  if (! XmlNameMatchesAscii(enc, name, nameEnd, KW_standalone)
      || isGeneralTextEntity) {
    *badPtr = name;
    return 0;
  }
  if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_yes)) {
    if (standalone)
      *standalone = 1;
  } else if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_no)) {
    if (standalone)
      *standalone = 0;
  } else {
    *badPtr = val;
    return 0;
  }
  while (isSpace(toAscii(enc, ptr, end)))
    ptr += enc->minBytesPerChar;
  if (ptr != end) {
    *badPtr = ptr;
    return 0;
  }
  return 1;
}